

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

void __thiscall
QRhiResourceUpdateBatch::uploadStaticBuffer
          (QRhiResourceUpdateBatch *this,QRhiBuffer *buf,quint32 offset,quint32 size,void *data)

{
  long lVar1;
  _func_int **pp_Var2;
  size_type sVar3;
  int in_ECX;
  QVarLengthArray<QRhiResourceUpdateBatchPrivate::BufferOp,_64LL> *this_00;
  QRhiBuffer *in_RDI;
  QRhiBuffer *in_R8;
  long in_FS_OFFSET;
  int idx;
  QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp> *in_stack_ffffffffffffff88;
  BufferOp *t;
  quint32 in_stack_ffffffffffffffa0;
  quint32 offset_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ECX != 0) {
    pp_Var2 = (in_RDI->super_QRhiResource)._vptr_QRhiResource;
    offset_00 = *(quint32 *)pp_Var2;
    *(quint32 *)pp_Var2 = offset_00 + 1;
    this_00 = (QVarLengthArray<QRhiResourceUpdateBatchPrivate::BufferOp,_64LL> *)
              (long)(int)offset_00;
    sVar3 = QVLABaseBase::size((QVLABaseBase *)((in_RDI->super_QRhiResource)._vptr_QRhiResource + 1)
                              );
    if ((long)this_00 < sVar3) {
      QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>::operator[]
                (in_stack_ffffffffffffff88,0x696120);
      QRhiResourceUpdateBatchPrivate::BufferOp::changeToStaticUpload
                ((BufferOp *)CONCAT44(offset_00,in_stack_ffffffffffffffa0),in_RDI,
                 (quint32)((ulong)this_00 >> 0x20),(quint32)this_00,in_stack_ffffffffffffff88);
    }
    else {
      t = (BufferOp *)((in_RDI->super_QRhiResource)._vptr_QRhiResource + 1);
      QRhiResourceUpdateBatchPrivate::BufferOp::staticUpload
                (in_R8,offset_00,in_stack_ffffffffffffffa0,in_RDI);
      QVarLengthArray<QRhiResourceUpdateBatchPrivate::BufferOp,_64LL>::append(this_00,t);
      QRhiResourceUpdateBatchPrivate::BufferOp::~BufferOp((BufferOp *)0x696180);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiResourceUpdateBatch::uploadStaticBuffer(QRhiBuffer *buf, quint32 offset, quint32 size, const void *data)
{
    if (size > 0) {
        const int idx = d->activeBufferOpCount++;
        if (idx < d->bufferOps.size())
            QRhiResourceUpdateBatchPrivate::BufferOp::changeToStaticUpload(&d->bufferOps[idx], buf, offset, size, data);
        else
            d->bufferOps.append(QRhiResourceUpdateBatchPrivate::BufferOp::staticUpload(buf, offset, size, data));
    }
}